

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  size_type *psVar1;
  string *psVar2;
  int iVar3;
  TestPartResult *pTVar4;
  long *plVar5;
  ostream *poVar6;
  uint line;
  size_type *psVar7;
  long lVar8;
  internal *piVar9;
  char *pcVar10;
  int i;
  undefined1 local_c0 [8];
  string location;
  string summary;
  int local_78;
  int local_74;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string detail;
  
  if ((int)((ulong)((long)(result->test_part_results_).
                          super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(result->test_part_results_).
                         super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249 < 1) {
LAB_00245a27:
    if ((int)((ulong)((long)(result->test_properties_).
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(result->test_properties_).
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) == 0) {
      pcVar10 = " />\n";
      lVar8 = 4;
      goto LAB_00245a72;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  }
  else {
    psVar1 = &detail._M_string_length;
    local_78 = 0;
    i = 0;
    local_74 = 0;
    do {
      pTVar4 = TestResult::GetTestPartResult(result,i);
      line = pTVar4->type_ - kNonFatalFailure;
      if (line < 2) {
        if (local_78 == 0 && local_74 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        piVar9 = (internal *)(pTVar4->file_name_)._M_string_length;
        if (piVar9 != (internal *)0x0) {
          piVar9 = (internal *)(pTVar4->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)local_c0,piVar9,(char *)(ulong)(uint)pTVar4->line_number_,line);
        psVar2 = (string *)(__str_1.field_2._M_local_buf + 8);
        __str_1.field_2._8_8_ = psVar1;
        std::__cxx11::string::_M_construct<char*>
                  (psVar2,local_c0,location._M_dataplus._M_p + (long)local_c0);
        std::__cxx11::string::append((char *)psVar2);
        plVar5 = (long *)std::__cxx11::string::append((char *)psVar2);
        location.field_2._8_8_ = &summary._M_string_length;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          summary._M_string_length = *psVar7;
          summary.field_2._M_allocated_capacity = plVar5[3];
        }
        else {
          summary._M_string_length = *psVar7;
          location.field_2._8_8_ = (size_type *)*plVar5;
        }
        summary._M_dataplus._M_p = (pointer)plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((size_type *)__str_1.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str_1.field_2._8_8_,detail._M_string_length + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        EscapeXml((string *)((long)&__str_1.field_2 + 8),(string *)((long)&location.field_2 + 8),
                  true);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)__str_1.field_2._8_8_,(long)detail._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" type=\"\">",10);
        if ((size_type *)__str_1.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str_1.field_2._8_8_,detail._M_string_length + 1);
        }
        local_70 = (undefined1  [8])&__str_1._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_c0,location._M_dataplus._M_p + (long)local_c0);
        std::__cxx11::string::append((char *)local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          detail._M_string_length = *psVar7;
          detail.field_2._M_allocated_capacity = plVar5[3];
          __str_1.field_2._8_8_ = psVar1;
        }
        else {
          detail._M_string_length = *psVar7;
          __str_1.field_2._8_8_ = (size_type *)*plVar5;
        }
        detail._M_dataplus._M_p = (pointer)plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_70 != (undefined1  [8])&__str_1._M_string_length) {
          operator_delete((void *)local_70,__str_1._M_string_length + 1);
        }
        RemoveInvalidXmlCharacters((string *)local_70,(string *)((long)&__str_1.field_2 + 8));
        OutputXmlCDataSection(stream,(char *)local_70);
        if (local_70 != (undefined1  [8])&__str_1._M_string_length) {
          operator_delete((void *)local_70,__str_1._M_string_length + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if ((size_type *)__str_1.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str_1.field_2._8_8_,detail._M_string_length + 1);
        }
        if ((size_type *)location.field_2._8_8_ != &summary._M_string_length) {
          operator_delete((void *)location.field_2._8_8_,summary._M_string_length + 1);
        }
        if (local_c0 != (undefined1  [8])&location._M_string_length) {
          operator_delete((void *)local_c0,location._M_string_length + 1);
        }
        local_78 = local_78 + 1;
      }
      else if (pTVar4->type_ == kSkip) {
        if (local_74 == 0 && local_78 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        piVar9 = (internal *)(pTVar4->file_name_)._M_string_length;
        if (piVar9 != (internal *)0x0) {
          piVar9 = (internal *)(pTVar4->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)local_c0,piVar9,(char *)(ulong)(uint)pTVar4->line_number_,line);
        psVar2 = (string *)(__str_1.field_2._M_local_buf + 8);
        __str_1.field_2._8_8_ = psVar1;
        std::__cxx11::string::_M_construct<char*>
                  (psVar2,local_c0,location._M_dataplus._M_p + (long)local_c0);
        std::__cxx11::string::append((char *)psVar2);
        plVar5 = (long *)std::__cxx11::string::append((char *)psVar2);
        location.field_2._8_8_ = &summary._M_string_length;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          summary._M_string_length = *psVar7;
          summary.field_2._M_allocated_capacity = plVar5[3];
        }
        else {
          summary._M_string_length = *psVar7;
          location.field_2._8_8_ = (size_type *)*plVar5;
        }
        summary._M_dataplus._M_p = (pointer)plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((size_type *)__str_1.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str_1.field_2._8_8_,detail._M_string_length + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <skipped message=\"",0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_70,(char *)location.field_2._8_8_,
                   (allocator<char> *)(summary.field_2._M_local_buf + 0xf));
        EscapeXml((string *)((long)&__str_1.field_2 + 8),(string *)local_70,true);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)__str_1.field_2._8_8_,(long)detail._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
        if ((size_type *)__str_1.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str_1.field_2._8_8_,detail._M_string_length + 1);
        }
        if (local_70 != (undefined1  [8])&__str_1._M_string_length) {
          operator_delete((void *)local_70,__str_1._M_string_length + 1);
        }
        local_70 = (undefined1  [8])&__str_1._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_c0,location._M_dataplus._M_p + (long)local_c0);
        std::__cxx11::string::append((char *)local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          detail._M_string_length = *psVar7;
          detail.field_2._M_allocated_capacity = plVar5[3];
          __str_1.field_2._8_8_ = psVar1;
        }
        else {
          detail._M_string_length = *psVar7;
          __str_1.field_2._8_8_ = (size_type *)*plVar5;
        }
        detail._M_dataplus._M_p = (pointer)plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_70 != (undefined1  [8])&__str_1._M_string_length) {
          operator_delete((void *)local_70,__str_1._M_string_length + 1);
        }
        RemoveInvalidXmlCharacters((string *)local_70,(string *)((long)&__str_1.field_2 + 8));
        OutputXmlCDataSection(stream,(char *)local_70);
        if (local_70 != (undefined1  [8])&__str_1._M_string_length) {
          operator_delete((void *)local_70,__str_1._M_string_length + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</skipped>\n",0xb);
        if ((size_type *)__str_1.field_2._8_8_ != psVar1) {
          operator_delete((void *)__str_1.field_2._8_8_,detail._M_string_length + 1);
        }
        if ((size_type *)location.field_2._8_8_ != &summary._M_string_length) {
          operator_delete((void *)location.field_2._8_8_,summary._M_string_length + 1);
        }
        if (local_c0 != (undefined1  [8])&location._M_string_length) {
          operator_delete((void *)local_c0,location._M_string_length + 1);
        }
        local_74 = local_74 + 1;
      }
      i = i + 1;
      iVar3 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar3 * -0x49249249) != i + iVar3 * 0x49249249 < 0);
    if (local_78 == 0 && local_74 == 0) goto LAB_00245a27;
  }
  OutputXmlTestProperties(stream,result);
  pcVar10 = "    </testcase>\n";
  lVar8 = 0x10;
LAB_00245a72:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,lVar8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}